

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<12>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<12> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double AWR;
  double dVar1;
  int N;
  
  AWR = *(double *)(head + 0x20);
  dVar1 = round(*(double *)(head + 0x28));
  N = 0x164eb8;
  Base::Base(&this->super_Base,(int)dVar1,AWR,*(int *)(head + 0x38));
  readPhotonProduction<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->photon_,(Type<12> *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0xc,*(int *)(head + 0x38),*(int *)(head + 0x18),
             *(int *)(head + 8),N);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,0xc);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try : Base( head.ZA(), head.AWR(), head.MT() ),
        photon_( readPhotonProduction( begin, end, lineNumber,
                                       MAT, 12, head.MT(),
                                       head.L1(), head.N1() ) ) {
    readSEND( begin, end, lineNumber, MAT, 12 );
  } catch ( std::exception& e ) {
    Log::info( "Trouble while reading section {} of File 12 of Material {}",
               head.MT(), MAT );
    throw e;
  }